

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

bool exchangeCountryOwnership(Player *attackingPlayer,Player *defendingPlayer,Country *country)

{
  ulong uVar1;
  __type _Var2;
  int id;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  size_type sVar4;
  reference ppCVar5;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar6;
  __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
  local_98;
  __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
  local_90;
  const_iterator local_88;
  string local_70;
  string local_50;
  ulong local_30;
  unsigned_long i;
  Country *country_local;
  Player *defendingPlayer_local;
  Player *attackingPlayer_local;
  
  i = (unsigned_long)country;
  country_local = (Country *)defendingPlayer;
  defendingPlayer_local = attackingPlayer;
  id = Player::getPlayerId(attackingPlayer);
  Map::Country::setPlayerOwnerID(country,id);
  local_30 = 0;
  while( true ) {
    uVar1 = local_30;
    pvVar3 = Player::getOwnedCountries((Player *)country_local);
    sVar4 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar3);
    if (sVar4 <= uVar1) {
      return false;
    }
    pvVar3 = Player::getOwnedCountries((Player *)country_local);
    ppCVar5 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar3,local_30);
    Map::Country::getCountryName_abi_cxx11_(&local_50,*ppCVar5);
    Map::Country::getCountryName_abi_cxx11_(&local_70,(Country *)i);
    _Var2 = std::operator==(&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var2) break;
    local_30 = local_30 + 1;
  }
  pvVar3 = Player::getOwnedCountries(defendingPlayer_local);
  pvVar6 = Player::getOwnedCountries((Player *)country_local);
  ppCVar5 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(pvVar6,local_30);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back(pvVar3,ppCVar5);
  pvVar3 = Player::getOwnedCountries((Player *)country_local);
  pvVar6 = Player::getOwnedCountries((Player *)country_local);
  local_98._M_current =
       (Country **)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar6);
  local_90 = __gnu_cxx::
             __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
             ::operator+(&local_98,local_30);
  __gnu_cxx::
  __normal_iterator<Map::Country*const*,std::vector<Map::Country*,std::allocator<Map::Country*>>>::
  __normal_iterator<Map::Country**>
            ((__normal_iterator<Map::Country*const*,std::vector<Map::Country*,std::allocator<Map::Country*>>>
              *)&local_88,&local_90);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::erase(pvVar3,local_88);
  return true;
}

Assistant:

static bool exchangeCountryOwnership(Player &attackingPlayer, Player *defendingPlayer, Map::Country &country) {
    country.setPlayerOwnerID(attackingPlayer.getPlayerId());

    for (unsigned long i = 0; i < defendingPlayer->getOwnedCountries()->size(); i++) {
        if (defendingPlayer->getOwnedCountries()->at(i)->getCountryName() == country.getCountryName()) {
            attackingPlayer.getOwnedCountries()->push_back(defendingPlayer->getOwnedCountries()->at(i));
            defendingPlayer->getOwnedCountries()->erase(defendingPlayer->getOwnedCountries()->begin() + i);
            return true;
        }
    }

    return false;
}